

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation.h
# Opt level: O0

void __thiscall
sptk::InputSourceInterpolation::~InputSourceInterpolation(InputSourceInterpolation *this)

{
  InputSourceInterface *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  in_RDI->_vptr_InputSourceInterface = (_func_int **)&PTR__InputSourceInterpolation_00128c58;
  ::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  ::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  ::std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  InputSourceInterface::~InputSourceInterface(in_RDI);
  return;
}

Assistant:

~InputSourceInterpolation() override {
  }